

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupFlopClass(Gia_Man_t *p,int iClass)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int local_38;
  
  if (p->vFlopClasses == (Vec_Int_t *)0x0) {
    __assert_fail("p->vFlopClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x4d4,"Gia_Man_t *Gia_ManDupFlopClass(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  iVar5 = p->nRegs;
  pVVar9 = p->vCis;
  iVar15 = pVVar9->nSize;
  if (iVar5 < iVar15) {
    lVar14 = 0;
    do {
      if (iVar15 <= lVar14) goto LAB_001df92f;
      iVar15 = pVVar9->pArray[lVar14];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_001df910;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_001df94e;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_001df94e;
      pGVar3[iVar15].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      iVar5 = p->nRegs;
      pVVar9 = p->vCis;
      iVar15 = pVVar9->nSize;
    } while (lVar14 < iVar15 - iVar5);
  }
  if (iVar5 < 1) {
LAB_001df616:
    local_38 = 0;
  }
  else {
    lVar14 = 0;
    do {
      iVar15 = p->vCis->nSize;
      uVar12 = (ulong)(uint)(iVar15 - iVar5) + lVar14;
      iVar10 = (int)uVar12;
      if ((iVar10 < 0) || (iVar15 <= iVar10)) goto LAB_001df92f;
      iVar15 = p->vCis->pArray[uVar12 & 0xffffffff];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_001df910;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if (p->vFlopClasses->nSize <= lVar14) goto LAB_001df92f;
      if (p->vFlopClasses->pArray[lVar14] != iClass) {
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar12 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar12 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar12 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_001df94e;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_001df94e;
        pGVar3[iVar15].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
        iVar5 = p->nRegs;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar5);
    if (iVar5 < 1) goto LAB_001df616;
    lVar14 = 0;
    local_38 = 0;
    do {
      iVar15 = p->vCis->nSize;
      uVar12 = (ulong)(uint)(iVar15 - iVar5) + lVar14;
      iVar10 = (int)uVar12;
      if ((iVar10 < 0) || (iVar15 <= iVar10)) goto LAB_001df92f;
      iVar15 = p->vCis->pArray[uVar12 & 0xffffffff];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_001df910;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if (p->vFlopClasses->nSize <= lVar14) goto LAB_001df92f;
      if (p->vFlopClasses->pArray[lVar14] == iClass) {
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar12 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar12 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar12 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) {
LAB_001df94e:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_001df94e;
        pGVar3[iVar15].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
        local_38 = local_38 + 1;
        iVar5 = p->nRegs;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar5);
  }
  iVar15 = p->nObjs;
  if (0 < iVar15) {
    lVar16 = 8;
    lVar14 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar12 = *(ulong *)((long)pGVar3 + lVar16 + -8);
      if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
        uVar1 = *(uint *)((long)pGVar3 +
                         lVar16 + (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3);
        if (((int)uVar1 < 0) ||
           (uVar13 = *(uint *)((long)pGVar3 +
                              lVar16 + (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar13 < 0)) goto LAB_001df96d;
        iVar5 = Gia_ManAppendAnd(p_00,uVar1 ^ (uint)(uVar12 >> 0x1d) & 1,
                                 uVar13 ^ (uint)(uVar12 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar16) = iVar5;
        iVar15 = p->nObjs;
      }
      lVar14 = lVar14 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar14 < iVar15);
    iVar5 = p->nRegs;
  }
  pVVar9 = p->vCos;
  iVar15 = pVVar9->nSize;
  if (iVar5 < iVar15) {
    lVar14 = 0;
    do {
      if (iVar15 <= lVar14) goto LAB_001df92f;
      iVar15 = pVVar9->pArray[lVar14];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_001df910;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar15;
      uVar13 = (uint)*(undefined8 *)pGVar3;
      uVar1 = pGVar3[-(ulong)(uVar13 & 0x1fffffff)].Value;
      if ((int)uVar1 < 0) goto LAB_001df96d;
      Gia_ManAppendCo(p_00,uVar13 >> 0x1d & 1 ^ uVar1);
      lVar14 = lVar14 + 1;
      iVar5 = p->nRegs;
      pVVar9 = p->vCos;
      iVar15 = pVVar9->nSize;
    } while (lVar14 < iVar15 - iVar5);
  }
  if (0 < iVar5) {
    lVar14 = 0;
    do {
      iVar15 = p->vCos->nSize;
      uVar12 = (ulong)(uint)(iVar15 - iVar5) + lVar14;
      iVar10 = (int)uVar12;
      if ((iVar10 < 0) || (iVar15 <= iVar10)) goto LAB_001df92f;
      iVar15 = p->vCos->pArray[uVar12 & 0xffffffff];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) goto LAB_001df910;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->vFlopClasses->nSize <= lVar14) goto LAB_001df92f;
      if (p->vFlopClasses->pArray[lVar14] != iClass) {
        pGVar3 = p->pObjs + iVar15;
        uVar13 = (uint)*(undefined8 *)pGVar3;
        uVar1 = pGVar3[-(ulong)(uVar13 & 0x1fffffff)].Value;
        if ((int)uVar1 < 0) goto LAB_001df96d;
        Gia_ManAppendCo(p_00,uVar13 >> 0x1d & 1 ^ uVar1);
        iVar5 = p->nRegs;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar5);
    if (0 < iVar5) {
      lVar14 = 0;
      iVar15 = 0;
      do {
        iVar10 = p->vCos->nSize;
        uVar12 = (ulong)(uint)(iVar10 - iVar5) + lVar14;
        iVar11 = (int)uVar12;
        if ((iVar11 < 0) || (iVar10 <= iVar11)) {
LAB_001df92f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar10 = p->vCos->pArray[uVar12 & 0xffffffff];
        if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_001df910:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (p->vFlopClasses->nSize <= lVar14) goto LAB_001df92f;
        if (p->vFlopClasses->pArray[lVar14] == iClass) {
          pGVar3 = p->pObjs + iVar10;
          uVar13 = (uint)*(undefined8 *)pGVar3;
          uVar1 = pGVar3[-(ulong)(uVar13 & 0x1fffffff)].Value;
          if ((int)uVar1 < 0) {
LAB_001df96d:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          Gia_ManAppendCo(p_00,uVar13 >> 0x1d & 1 ^ uVar1);
          iVar15 = iVar15 + 1;
          iVar5 = p->nRegs;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar5);
      goto LAB_001df8ea;
    }
  }
  iVar15 = 0;
LAB_001df8ea:
  if (local_38 != iVar15) {
    __assert_fail("Counter1 == Counter2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x4ec,"Gia_Man_t *Gia_ManDupFlopClass(Gia_Man_t *, int)");
  }
  Gia_ManSetRegNum(p_00,local_38);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupFlopClass( Gia_Man_t * p, int iClass )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj;
    int i, Counter1 = 0, Counter2 = 0;
    assert( p->vFlopClasses != NULL );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) != iClass )
            pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) == iClass )
            pObj->Value = Gia_ManAppendCi( pNew ), Counter1++;
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) != iClass )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) == iClass )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) ), Counter2++;
    assert( Counter1 == Counter2 );
    Gia_ManSetRegNum( pNew, Counter1 );
    return pNew;
}